

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar2 = (this->m_in)._M_len;
  pcVar3 = (this->m_in)._M_str;
  uVar4 = this->pos;
  while (uVar4 < uVar2) {
    cVar1 = pcVar3[uVar4];
    if ((9 < (int)cVar1 - 0x30U) && (cVar1 != 'e')) {
      if (cVar1 != '-') {
        if ((cVar1 == '.') || (cVar1 == 'E')) goto LAB_00149e95;
        if (cVar1 != '+') break;
      }
      if ((uVar4 != 0) && ((byte)(pcVar3[uVar4 - 1] | 0x20U) != 0x65)) break;
    }
LAB_00149e95:
    uVar4 = uVar4 + 1;
    this->pos = uVar4;
  }
  make_token(__return_storage_ptr__,this,Number);
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos];
      // be very permissive in lexer (we'll catch errors when conversion happens)
      if (!(std::isdigit(ch) || ch == '.' || ch == 'e' || ch == 'E' || (ch == '+' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')) || (ch == '-' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')))) {
        break;
      }
      pos += 1;
    }
    return make_token(Token::Kind::Number);
  }